

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::FieldDescriptorCompare::operator()
          (FieldDescriptorCompare *this,FieldDescriptor *f1,FieldDescriptor *f2)

{
  ushort uVar1;
  ushort uVar2;
  char *pcVar3;
  int iVar4;
  ulong __n;
  bool bVar5;
  ulong uVar7;
  ulong uVar8;
  int iVar6;
  
  if (this == (FieldDescriptorCompare *)0x0) {
    bVar5 = false;
  }
  else if (f1 == (FieldDescriptor *)0x0) {
    bVar5 = true;
  }
  else {
    uVar1 = *(ushort *)(*(long *)(this + 8) + 2);
    uVar7 = (ulong)uVar1;
    pcVar3 = (f1->all_names_).payload_;
    uVar2 = *(ushort *)(pcVar3 + 2);
    uVar8 = (ulong)uVar2;
    __n = uVar8;
    if (uVar7 < uVar8) {
      __n = uVar7;
    }
    if (__n == 0) {
      iVar4 = 0;
    }
    else {
      iVar4 = memcmp((void *)(*(long *)(this + 8) + ~uVar7),pcVar3 + ~uVar8,__n);
    }
    iVar6 = (uint)uVar1 - (uint)uVar2;
    if (iVar4 != 0) {
      iVar6 = iVar4;
    }
    bVar5 = SUB41((uint)iVar6 >> 0x1f,0);
  }
  return bVar5;
}

Assistant:

bool operator()(const FieldDescriptor* f1, const FieldDescriptor* f2) const {
    if (f1 == nullptr) {
      return false;
    }
    if (f2 == nullptr) {
      return true;
    }
    return f1->full_name() < f2->full_name();
  }